

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void Scrollbar(ImGuiWindow *window,bool horizontal)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  ImU32 col;
  uint uVar3;
  bool bVar4;
  float fVar5;
  float _y;
  ImGuiCol local_144;
  ImVec2 *local_140;
  float local_138;
  float local_134;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_f4;
  float local_f0;
  float local_e8;
  byte local_e1;
  char *local_e0;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImU32 local_b0;
  float local_ac;
  ImU32 grab_col;
  float scroll_v_norm;
  bool seek_absolute;
  ImVec2 *pIStack_a0;
  float clicked_v_norm;
  float *click_delta_to_grab_center_v;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  float scroll_max;
  bool previously_held;
  bool hovered;
  float fStack_7c;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  float win_size_contents_v;
  float win_size_avail_v;
  float scroll_v;
  float scrollbar_size_v;
  uint local_60;
  float local_5c;
  int window_rounding_corners;
  float window_rounding;
  ImRect bb;
  float border_size;
  ImRect window_rect;
  float other_scrollbar_size_w;
  bool other_scrollbar;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  bool horizontal_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  if (horizontal) {
    local_e0 = "#SCROLLX";
  }
  else {
    local_e0 = "#SCROLLY";
  }
  id_00 = ImGuiWindow::GetID(window,local_e0,(char *)0x0);
  if (horizontal) {
    local_e1 = window->ScrollbarY;
  }
  else {
    local_e1 = window->ScrollbarX;
  }
  local_e1 = local_e1 & 1;
  if (local_e1 == 0) {
    local_e8 = 0.0;
  }
  else {
    local_e8 = (pIVar2->Style).ScrollbarSize;
  }
  join_0x00001240_0x00001200_ = ImGuiWindow::Rect(window);
  bb.Max.x = window->BorderSize;
  if (horizontal) {
    ImRect::ImRect((ImRect *)&window_rounding_corners,(window->Pos).x + bb.Max.x,
                   window_rect.Min.y - (pIVar2->Style).ScrollbarSize,
                   (window_rect.Min.x - local_e8) - bb.Max.x,window_rect.Min.y - bb.Max.x);
  }
  else {
    ImRect::ImRect((ImRect *)&window_rounding_corners,
                   window_rect.Min.x - (pIVar2->Style).ScrollbarSize,(window->Pos).y + bb.Max.x,
                   window_rect.Min.x - bb.Max.x,(window_rect.Min.y - local_e8) - bb.Max.x);
    fVar5 = ImGuiWindow::TitleBarHeight(window);
    if ((window->Flags & 0x400U) == 0) {
      local_f0 = 0.0;
    }
    else {
      local_f0 = ImGuiWindow::MenuBarHeight(window);
    }
    window_rounding = fVar5 + local_f0 + window_rounding;
  }
  if ((window->Flags & 0x100000U) == 0) {
    local_f4 = (pIVar2->Style).WindowRounding;
  }
  else {
    local_f4 = (pIVar2->Style).ChildWindowRounding;
  }
  local_5c = local_f4;
  if (horizontal) {
    local_60 = 4;
    if (local_e1 != 0) {
      local_60 = 0;
    }
    local_60 = local_60 | 8;
  }
  else {
    bVar4 = false;
    if ((window->Flags & 1U) != 0) {
      bVar4 = (window->Flags & 0x400U) == 0;
    }
    local_60 = 0;
    if (bVar4) {
      local_60 = 2;
    }
    uVar3 = 4;
    if (local_e1 != 0) {
      uVar3 = 0;
    }
    local_60 = local_60 | uVar3;
  }
  pIVar1 = window->DrawList;
  col = ImGui::GetColorU32(0xe,1.0);
  ImDrawList::AddRectFilled(pIVar1,(ImVec2 *)&window_rounding_corners,&bb.Min,col,local_5c,local_60)
  ;
  fVar5 = ImClamp((float)(int)(((bb.Min.x - (float)window_rounding_corners) - 2.0) * 0.5),0.0,3.0);
  _y = ImClamp((float)(int)(((bb.Min.y - window_rounding) - 2.0) * 0.5),0.0,3.0);
  ImVec2::ImVec2((ImVec2 *)&scroll_v,fVar5,_y);
  ImRect::Reduce((ImRect *)&window_rounding_corners,(ImVec2 *)&scroll_v);
  if (horizontal) {
    local_11c = ImRect::GetWidth((ImRect *)&window_rounding_corners);
  }
  else {
    local_11c = ImRect::GetHeight((ImRect *)&window_rounding_corners);
  }
  win_size_avail_v = local_11c;
  if (horizontal) {
    local_120 = (window->Scroll).x;
  }
  else {
    local_120 = (window->Scroll).y;
  }
  win_size_contents_v = local_120;
  if (horizontal) {
    local_124 = (window->Size).x;
  }
  else {
    local_124 = (window->Size).y;
  }
  local_124 = local_124 - local_e8;
  if (horizontal) {
    local_128 = (window->SizeContents).x;
  }
  else {
    local_128 = (window->SizeContents).y;
  }
  grab_h_norm = local_128;
  grab_h_pixels = local_124;
  fVar5 = ImMax(local_128,local_124);
  fVar5 = ImSaturate(local_124 / fVar5);
  fVar5 = ImMax(local_11c * fVar5,(pIVar2->Style).GrabMinSize);
  fStack_7c = ImMin(fVar5,win_size_avail_v);
  scroll_max = fStack_7c / win_size_avail_v;
  scroll_ratio._3_1_ = 0;
  scroll_ratio._2_1_ = 0;
  scroll_ratio._1_1_ = pIVar2->ActiveId == id_00;
  ImGui::ButtonBehavior
            ((ImRect *)&window_rounding_corners,id_00,(bool *)((long)&scroll_ratio + 2),
             (bool *)((long)&scroll_ratio + 3),0);
  grab_v_norm = ImMax(1.0,grab_h_norm - grab_h_pixels);
  scrollbar_pos_v = ImSaturate(win_size_contents_v / grab_v_norm);
  mouse_pos_v = (scrollbar_pos_v * (win_size_avail_v - fStack_7c)) / win_size_avail_v;
  if (((scroll_ratio._3_1_ & 1) != 0) && (scroll_max < 1.0)) {
    if (horizontal) {
      local_134 = (float)window_rounding_corners;
    }
    else {
      local_134 = window_rounding;
    }
    click_delta_to_grab_center_v._4_4_ = local_134;
    if (horizontal) {
      local_138 = (pIVar2->IO).MousePos.x;
    }
    else {
      local_138 = (pIVar2->IO).MousePos.y;
    }
    click_delta_to_grab_center_v._0_4_ = local_138;
    if (horizontal) {
      local_140 = &pIVar2->ScrollbarClickDeltaToGrabCenter;
    }
    else {
      local_140 = (ImVec2 *)&(pIVar2->ScrollbarClickDeltaToGrabCenter).y;
    }
    pIStack_a0 = local_140;
    scroll_v_norm = ImSaturate((local_138 - local_134) / win_size_avail_v);
    ImGui::SetHoveredID(id_00);
    grab_col._3_1_ = 0;
    if ((scroll_ratio._1_1_ & 1) == 0) {
      if ((scroll_v_norm < mouse_pos_v) || (mouse_pos_v + scroll_max < scroll_v_norm)) {
        grab_col._3_1_ = 1;
        pIStack_a0->x = 0.0;
      }
      else {
        pIStack_a0->x = -scroll_max * 0.5 + (scroll_v_norm - mouse_pos_v);
      }
    }
    local_ac = ImSaturate((-scroll_max * 0.5 + (scroll_v_norm - pIStack_a0->x)) / (1.0 - scroll_max)
                         );
    win_size_contents_v = (float)(int)(local_ac * grab_v_norm + 0.5);
    if (horizontal) {
      (window->Scroll).x = win_size_contents_v;
    }
    else {
      (window->Scroll).y = win_size_contents_v;
    }
    scrollbar_pos_v = ImSaturate(win_size_contents_v / grab_v_norm);
    mouse_pos_v = (scrollbar_pos_v * (win_size_avail_v - fStack_7c)) / win_size_avail_v;
    if ((grab_col._3_1_ & 1) != 0) {
      pIStack_a0->x = -scroll_max * 0.5 + (scroll_v_norm - mouse_pos_v);
    }
  }
  if ((scroll_ratio._3_1_ & 1) == 0) {
    local_144 = 0xf;
    if ((scroll_ratio._2_1_ & 1) != 0) {
      local_144 = 0x10;
    }
  }
  else {
    local_144 = 0x11;
  }
  local_b0 = ImGui::GetColorU32(local_144,1.0);
  if (horizontal) {
    pIVar1 = window->DrawList;
    fVar5 = ImLerp((float)window_rounding_corners,bb.Min.x,mouse_pos_v);
    ImVec2::ImVec2(&local_b8,fVar5,window_rounding);
    fVar5 = ImLerp((float)window_rounding_corners,bb.Min.x,mouse_pos_v);
    ImVec2::ImVec2(&local_c0,fVar5 + fStack_7c,bb.Min.y);
    ImDrawList::AddRectFilled
              (pIVar1,&local_b8,&local_c0,local_b0,(pIVar2->Style).ScrollbarRounding,0xf);
  }
  else {
    pIVar1 = window->DrawList;
    fVar5 = ImLerp(window_rounding,bb.Min.y,mouse_pos_v);
    ImVec2::ImVec2(&local_c8,(float)window_rounding_corners,fVar5);
    fVar5 = ImLerp(window_rounding,bb.Min.y,mouse_pos_v);
    ImVec2::ImVec2(&local_d0,bb.Min.x,fVar5 + fStack_7c);
    ImDrawList::AddRectFilled
              (pIVar1,&local_c8,&local_d0,local_b0,(pIVar2->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

static void Scrollbar(ImGuiWindow* window, bool horizontal)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->BorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);

    float window_rounding = (window->Flags & ImGuiWindowFlags_ChildWindow) ? style.ChildWindowRounding : style.WindowRounding;
    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = 8 | (other_scrollbar ? 0 : 4);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? 2 : 0) | (other_scrollbar ? 0 : 4);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_ScrollbarBg), window_rounding, window_rounding_corners);
    bb.Reduce(ImVec2(ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main axis of the scrollbar
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->Size.x : window->Size.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // The grabable box size generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    const float grab_h_pixels = ImMin(ImMax(scrollbar_size_v * ImSaturate(win_size_avail_v / ImMax(win_size_contents_v, win_size_avail_v)), style.GrabMinSize), scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ImGui::ButtonBehavior(bb, id, &hovered, &held);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        ImGui::SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = ImGui::GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    if (horizontal)
        window->DrawList->AddRectFilled(ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y), ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y), grab_col, style.ScrollbarRounding);
    else
        window->DrawList->AddRectFilled(ImVec2(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm)), ImVec2(bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels), grab_col, style.ScrollbarRounding);
}